

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O2

optional<uint256> * __thiscall
BlockFilterIndex::ReadFilterHeader
          (optional<uint256> *__return_storage_ptr__,BlockFilterIndex *this,int height,
          uint256 *expected_block_hash)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  string sStack_d8;
  string local_b8;
  pair<uint256,_(anonymous_namespace)::DBVal> read_out;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  read_out.second.pos.nFile = -1;
  read_out.second.pos.nPos = 0;
  local_b8._M_dataplus._M_p._0_4_ = height;
  bVar2 = CDBWrapper::
          Read<(anonymous_namespace)::DBHeightKey,std::pair<uint256,(anonymous_namespace)::DBVal>>
                    (&((this->m_db)._M_t.
                       super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>.
                       super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->super_CDBWrapper
                     ,(DBHeightKey *)&local_b8,&read_out);
  if (bVar2) {
    bVar2 = operator!=((base_blob<256U> *)&read_out,&expected_block_hash->super_base_blob<256U>);
    if (!bVar2) {
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 0x10) =
           read_out.second.header.super_base_blob<256U>.m_data._M_elems._16_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 0x18) =
           read_out.second.header.super_base_blob<256U>.m_data._M_elems._24_8_;
      *(undefined4 *)
       &(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
        super__Optional_payload_base<uint256>._M_payload =
           read_out.second.header.super_base_blob<256U>.m_data._M_elems._0_4_;
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 4) =
           read_out.second.header.super_base_blob<256U>.m_data._M_elems._4_4_;
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 8) =
           read_out.second.header.super_base_blob<256U>.m_data._M_elems._8_4_;
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 0xc) =
           read_out.second.header.super_base_blob<256U>.m_data._M_elems._12_4_;
      bVar2 = true;
      goto LAB_003d0d6d;
    }
    base_blob<256u>::ToString_abi_cxx11_(&local_b8,(base_blob<256u> *)&read_out);
    base_blob<256u>::ToString_abi_cxx11_(&sStack_d8,(base_blob<256u> *)expected_block_hash);
    logging_function._M_str = "ReadFilterHeader";
    logging_function._M_len = 0x10;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/blockfilterindex.cpp"
    ;
    source_file._M_len = 0x6a;
    LogPrintFormatInternal<char[17],std::__cxx11::string,std::__cxx11::string>
              (logging_function,source_file,0xf4,ALL,Error,(ConstevalFormatString<3U>)0x6ced17,
               (char (*) [17])"ReadFilterHeader",&local_b8,&sStack_d8);
    std::__cxx11::string::~string((string *)&sStack_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  bVar2 = false;
LAB_003d0d6d:
  (__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
  super__Optional_payload_base<uint256>._M_engaged = bVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<uint256> BlockFilterIndex::ReadFilterHeader(int height, const uint256& expected_block_hash)
{
    std::pair<uint256, DBVal> read_out;
    if (!m_db->Read(DBHeightKey(height), read_out)) {
        return std::nullopt;
    }

    if (read_out.first != expected_block_hash) {
        LogError("%s: previous block header belongs to unexpected block %s; expected %s\n",
                         __func__, read_out.first.ToString(), expected_block_hash.ToString());
        return std::nullopt;
    }

    return read_out.second.header;
}